

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O3

uint P_GetSkyboxPortal(ASkyViewpoint *actor)

{
  FSectorPortal *pFVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  uint uVar5;
  long lVar6;
  FSectorPortal *pFVar7;
  ASkyViewpoint *pAVar8;
  ulong uVar9;
  PClass *pPVar4;
  
  if (actor == (ASkyViewpoint *)0x0) {
    uVar9 = 1;
  }
  else {
    uVar3 = (ulong)sectorPortals.Count;
    if (uVar3 != 0) {
      lVar6 = 0x38;
      uVar9 = 0;
      pFVar7 = sectorPortals.Array;
      do {
        pAVar8 = *(ASkyViewpoint **)((long)&pFVar7->mType + lVar6);
        if (pAVar8 == (ASkyViewpoint *)0x0) {
LAB_00474541:
          pAVar8 = (ASkyViewpoint *)0x0;
        }
        else if (((pAVar8->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
          *(undefined8 *)((long)&pFVar7->mType + lVar6) = 0;
          pFVar7 = sectorPortals.Array;
          goto LAB_00474541;
        }
        if (pAVar8 == actor) goto LAB_0047460f;
        uVar9 = uVar9 + 1;
        lVar6 = lVar6 + 0x40;
      } while (uVar3 != uVar9);
    }
    TArray<FSectorPortal,_FSectorPortal>::Grow(&sectorPortals,1);
    pFVar7 = sectorPortals.Array;
    uVar9 = (ulong)sectorPortals.Count;
    sectorPortals.Count = sectorPortals.Count + 1;
    pFVar1 = sectorPortals.Array + uVar9;
    pFVar1->mPlaneZ = 0.0;
    *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(&pFVar1->mPlaneZ + 1) =
         (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
    pFVar7[uVar9].mDisplacement.X = 0.0;
    pFVar7[uVar9].mDisplacement.Y = 0.0;
    pFVar7[uVar9].mOrigin = (sector_t *)0x0;
    (&pFVar7[uVar9].mOrigin)[1] = (sector_t *)0x0;
    pFVar7 = pFVar7 + uVar9;
    pFVar7->mType = 0;
    pFVar7->mFlags = 0;
    pFVar7->mPartner = 0;
    pFVar7->mPlane = 0;
    pPVar4 = (actor->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(actor->super_AActor).super_DThinker.super_DObject._vptr_DObject)(actor);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar2);
      (actor->super_AActor).super_DThinker.super_DObject.Class = pPVar4;
    }
    pFVar7 = sectorPortals.Array;
    if (pPVar4 == ASkyCamCompat::RegistrationInfo.MyClass) {
      uVar5 = 0;
    }
    else {
      do {
        pPVar4 = pPVar4->ParentClass;
        if (pPVar4 == ASkyCamCompat::RegistrationInfo.MyClass) break;
      } while (pPVar4 != (PClass *)0x0);
      uVar5 = (uint)(pPVar4 == (PClass *)0x0);
    }
    sectorPortals.Array[uVar9].mFlags = uVar5;
    pFVar7[uVar9].mSkybox.field_0.p = &actor->super_AActor;
    sectorPortals.Array[uVar9].mDestination = (actor->super_AActor).Sector;
  }
LAB_0047460f:
  return (uint)uVar9;
}

Assistant:

unsigned P_GetSkyboxPortal(ASkyViewpoint *actor)
{
	if (actor == NULL) return 1;	// this means a regular sky.
	for (unsigned i = 0;i<sectorPortals.Size();i++)
	{
		if (sectorPortals[i].mSkybox == actor) return i;
	}
	unsigned i = sectorPortals.Reserve(1);
	memset(&sectorPortals[i], 0, sizeof(sectorPortals[i]));
	sectorPortals[i].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[i].mFlags = actor->GetClass()->IsDescendantOf(RUNTIME_CLASS(ASkyCamCompat)) ? 0 : PORTSF_SKYFLATONLY;
	sectorPortals[i].mSkybox = actor;
	sectorPortals[i].mDestination = actor->Sector;
	return i;
}